

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gles31::Functional::UniformCase::iterate(UniformCase *this)

{
  pointer log;
  UniformCollection *pUVar1;
  RenderContext *pRVar2;
  deUint32 dVar3;
  uint uVar4;
  int iVar5;
  pointer pUVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
  basicUniforms;
  vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
  basicUniformReportsRef;
  value_type local_3e0;
  value_type local_3c0;
  string fragmentSource;
  string vertexSource;
  Random rnd;
  int samplerUnitCounter;
  uint uStack_34c;
  ostringstream local_348 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338 [4];
  ios_base local_2d8 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_2c0;
  undefined1 local_2a0 [208];
  ShaderProgram dummyProgram;
  ShaderProgram program;
  
  dVar3 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar4 = tcu::CommandLine::getBaseSeed(((this->super_TestCase).m_context)->m_testCtx->m_cmdLine);
  deRandom_init(&rnd.m_rnd,dVar3 ^ uVar4);
  log = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  basicUniforms.
  super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  basicUniforms.
  super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  basicUniforms.
  super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  basicUniformReportsRef.
  super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  basicUniformReportsRef.
  super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  basicUniformReportsRef.
  super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _samplerUnitCounter = (pointer)((ulong)uStack_34c << 0x20);
  pUVar1 = (this->m_uniformCollection).m_ptr;
  pUVar6 = (pUVar1->m_uniforms).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pUVar1->m_uniforms).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar6) >> 3) *
          -0x49249249) {
    lVar8 = 0x20;
    lVar9 = 0;
    do {
      generateBasicUniforms
                (this,&basicUniforms,&basicUniformReportsRef,
                 (VarType *)((long)&(pUVar6->name)._M_dataplus._M_p + lVar8),
                 *(char **)((long)pUVar6 + lVar8 + -0x20),true,&samplerUnitCounter,&rnd);
      lVar9 = lVar9 + 1;
      pUVar1 = (this->m_uniformCollection).m_ptr;
      pUVar6 = (pUVar1->m_uniforms).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x38;
    } while (lVar9 < (int)((ulong)((long)(pUVar1->m_uniforms).
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar6)
                          >> 3) * -0x49249249);
  }
  generateVertexSource_abi_cxx11_(&vertexSource,this,&basicUniforms);
  generateFragmentSource_abi_cxx11_(&fragmentSource,this,&basicUniforms);
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&samplerUnitCounter,0,0xac);
  local_2a0._0_8_ = (pointer)0x0;
  local_2a0[8] = 0;
  local_2a0._9_7_ = 0;
  local_2a0[0x10] = 0;
  local_2a0._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&samplerUnitCounter,&vertexSource);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_338,&fragmentSource);
  glu::ShaderProgram::ShaderProgram(&program,pRVar2,(ProgramSources *)&samplerUnitCounter);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2a0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_2c0);
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&samplerUnitCounter + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3c0,"#version 310 es\nvoid main (void) { gl_Position = vec4(1.0); }\n"
             ,"");
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3e0,
             "#version 310 es\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\nvoid main (void) { dEQP_FragColor = vec4(0.0, 0.0, 1.0, 1.0); }\n"
             ,"");
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&samplerUnitCounter,0,0xac);
  local_2a0._0_8_ = (pointer)0x0;
  local_2a0[8] = 0;
  local_2a0._9_7_ = 0;
  local_2a0[0x10] = 0;
  local_2a0._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&samplerUnitCounter,&local_3c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_338,&local_3e0);
  glu::ShaderProgram::ShaderProgram(&dummyProgram,pRVar2,(ProgramSources *)&samplerUnitCounter);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2a0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_2c0);
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&samplerUnitCounter + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  glu::operator<<((TestLog *)log,&program);
  if (program.m_program.m_info.linkOk == false) {
    pcVar7 = "Compile failed";
  }
  else {
    if (dummyProgram.m_program.m_info.linkOk != false) {
      _samplerUnitCounter = log;
      std::__cxx11::ostringstream::ostringstream(local_348);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_348,
                 "// Note: calling glUseProgram with a dummy program (will only use the real program once it\'s needed for rendering)"
                 ,0x72);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&samplerUnitCounter,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
      std::__cxx11::ostringstream::~ostringstream(local_348);
      std::ios_base::~ios_base(local_2d8);
      glu::CallLogWrapper::glUseProgram
                (&this->super_CallLogWrapper,dummyProgram.m_program.m_program);
      iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                        (this,&basicUniforms,&basicUniformReportsRef,&program,&rnd);
      pcVar7 = "Failed";
      if ((byte)iVar5 != 0) {
        pcVar7 = "Passed";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (uint)(byte)((byte)iVar5 ^ 1),pcVar7);
      goto LAB_0154e90c;
    }
    glu::operator<<((TestLog *)log,&dummyProgram);
    pcVar7 = "Compilation of dummy program failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
             pcVar7);
LAB_0154e90c:
  glu::ShaderProgram::~ShaderProgram(&dummyProgram);
  glu::ShaderProgram::~ShaderProgram(&program);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fragmentSource._M_dataplus._M_p != &fragmentSource.field_2) {
    operator_delete(fragmentSource._M_dataplus._M_p,fragmentSource.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vertexSource._M_dataplus._M_p != &vertexSource.field_2) {
    operator_delete(vertexSource._M_dataplus._M_p,vertexSource.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
  ::~vector(&basicUniformReportsRef);
  std::
  vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
  ::~vector(&basicUniforms);
  return STOP;
}

Assistant:

UniformCase::IterateResult UniformCase::iterate (void)
{
	Random							rnd				(deStringHash(getName()) ^ (deUint32)m_context.getTestContext().getCommandLine().getBaseSeed());
	TestLog&						log				= m_testCtx.getLog();
	vector<BasicUniform>			basicUniforms;
	vector<BasicUniformReportRef>	basicUniformReportsRef;

	{
		int samplerUnitCounter = 0;
		for (int i = 0; i < (int)m_uniformCollection->getNumUniforms(); i++)
			generateBasicUniforms(basicUniforms, basicUniformReportsRef, m_uniformCollection->getUniform(i).type, m_uniformCollection->getUniform(i).name.c_str(), true, samplerUnitCounter, rnd);
	}

	const string					vertexSource	= generateVertexSource(basicUniforms);
	const string					fragmentSource	= generateFragmentSource(basicUniforms);
	const ShaderProgram				program			(m_context.getRenderContext(), glu::makeVtxFragSources(vertexSource, fragmentSource));

	// A dummy program that we'll give to glUseProgram before we actually need
	// the real program above, to see if an implementation tries to use the
	// currently active program for something inappropriate (instead of the
	// program given as argument to, say, glProgramUniform*).
	const ShaderProgram				dummyProgram	(m_context.getRenderContext(), glu::makeVtxFragSources("#version 310 es\n"
																										   "void main (void) { gl_Position = vec4(1.0); }\n",

																										   "#version 310 es\n"
																										   "layout(location = 0) out mediump vec4 dEQP_FragColor;\n"
																										   "void main (void) { dEQP_FragColor = vec4(0.0, 0.0, 1.0, 1.0); }\n"));

	log << program;

	if (!program.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return STOP;
	}

	if (!dummyProgram.isOk())
	{
		log << dummyProgram;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compilation of dummy program failed");
		return STOP;
	}

	log << TestLog::Message << "// Note: calling glUseProgram with a dummy program (will only use the real program once it's needed for rendering)" << TestLog::EndMessage;
	glUseProgram(dummyProgram.getProgram());

	const bool success = test(basicUniforms, basicUniformReportsRef, program, rnd);
	m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							success ? "Passed"				: "Failed");

	return STOP;
}